

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

void DeinitMenus(void)

{
  FMenuDescriptor *this;
  bool bVar1;
  Pair *pair;
  Iterator it;
  
  it.Map = &MenuDescriptors;
  it.Position = 0;
  while( true ) {
    bVar1 = TMapIterator<FName,_FMenuDescriptor_*,_TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>_>
            ::NextPair(&it,&pair);
    if (!bVar1) break;
    if (pair->Value != (FMenuDescriptor *)0x0) {
      (*pair->Value->_vptr_FMenuDescriptor[1])();
    }
    pair->Value = (FMenuDescriptor *)0x0;
  }
  it.Map = (TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_> *)
           &OptionValues;
  it.Position = 0;
  while( true ) {
    bVar1 = TMapIterator<FName,_FOptionValues_*,_TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>_>
            ::NextPair((TMapIterator<FName,_FOptionValues_*,_TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>_>
                        *)&it,(Pair **)&pair);
    if (!bVar1) break;
    this = pair->Value;
    if (this != (FMenuDescriptor *)0x0) {
      TArray<FOptionValues::Pair,_FOptionValues::Pair>::~TArray
                ((TArray<FOptionValues::Pair,_FOptionValues::Pair> *)this);
    }
    operator_delete(this,0x10);
    pair->Value = (FMenuDescriptor *)0x0;
  }
  TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::Clear
            (&MenuDescriptors,1);
  TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::Clear
            (&OptionValues,1);
  DMenu::CurrentMenu = (DMenu *)0x0;
  TArray<FListMenuItem_*,_FListMenuItem_*>::Clear
            (&DefaultListMenuSettings.mItems.super_TArray<FListMenuItem_*,_FListMenuItem_*>);
  ClearSaveGames();
  return;
}

Assistant:

static void BuildEpisodeMenu()
{
	// Build episode menu
	bool success = false;
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Episodemenu);
	if (desc != NULL)
	{
		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			int posy = ld->mYpos;
			int topy = posy;

			// Get lowest y coordinate of any static item in the menu
			for(unsigned i = 0; i < ld->mItems.Size(); i++)
			{
				int y = ld->mItems[i]->GetY();
				if (y < topy) topy = y;
			}

			// center the menu on the screen if the top space is larger than the bottom space
			int totalheight = posy + AllEpisodes.Size() * ld->mLinespacing - topy;

			if (totalheight < 190 || AllEpisodes.Size() == 1)
			{
				int newtop = (200 - totalheight + topy) / 2;
				int topdelta = newtop - topy;
				if (topdelta < 0)
				{
					for(unsigned i = 0; i < ld->mItems.Size(); i++)
					{
						ld->mItems[i]->OffsetPositionY(topdelta);
					}
					posy -= topdelta;
				}

				ld->mSelectedItem = ld->mItems.Size();
				for(unsigned i = 0; i < AllEpisodes.Size(); i++)
				{
					FListMenuItem *it;
					if (AllEpisodes[i].mPicName.IsNotEmpty())
					{
						FTextureID tex = GetMenuTexture(AllEpisodes[i].mPicName);
						it = new FListMenuItemPatch(ld->mXpos, posy, ld->mLinespacing, AllEpisodes[i].mShortcut, 
							tex, NAME_Skillmenu, i);
					}
					else
					{
						it = new FListMenuItemText(ld->mXpos, posy, ld->mLinespacing, AllEpisodes[i].mShortcut, 
							AllEpisodes[i].mEpisodeName, ld->mFont, ld->mFontColor, ld->mFontColor2, NAME_Skillmenu, i);
					}
					ld->mItems.Push(it);
					posy += ld->mLinespacing;
				}
				if (AllEpisodes.Size() == 1)
				{
					ld->mAutoselect = ld->mSelectedItem;
				}
				success = true;
			}
		}
	}
	if (!success)
	{
		// Couldn't create the episode menu, either because there's too many episodes or some error occured
		// Create an option menu for episode selection instead.
		FOptionMenuDescriptor *od = new FOptionMenuDescriptor;
		if (desc != NULL) delete *desc;
		MenuDescriptors[NAME_Episodemenu] = od;
		od->mType = MDESC_OptionsMenu;
		od->mMenuName = NAME_Episodemenu;
		od->mTitle = "$MNU_EPISODE";
		od->mSelectedItem = 0;
		od->mScrollPos = 0;
		od->mClass = NULL;
		od->mPosition = -15;
		od->mScrollTop = 0;
		od->mIndent = 160;
		od->mDontDim = false;
		for(unsigned i = 0; i < AllEpisodes.Size(); i++)
		{
			FOptionMenuItemSubmenu *it = new FOptionMenuItemSubmenu(AllEpisodes[i].mEpisodeName, "Skillmenu", i);
			od->mItems.Push(it);
		}
	}
}